

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int multiSelect(Parse *pParse,Select *p,SelectDest *pDest)

{
  byte *pbVar1;
  u32 *puVar2;
  sqlite3 *psVar3;
  Parse *pPVar4;
  SrcList *pSVar5;
  Vdbe *p_00;
  bool bVar6;
  byte bVar7;
  u8 uVar8;
  LogEst LVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int p2;
  int iVar14;
  int iVar15;
  int iVar16;
  Vdbe *pVVar17;
  Select *pSVar18;
  int *zP4;
  ExprList *pEVar19;
  Expr *pEVar20;
  KeyInfo *pKVar21;
  CollSeq *pCVar22;
  Op *pOVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  anon_union_4_2_6146edf4_for_u *paVar27;
  Select *pSVar28;
  char *pcVar29;
  int nExtra;
  ulong extraout_RDX;
  ulong uVar30;
  short sVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  Select *pSVar35;
  int iVar36;
  long lVar37;
  bool bVar38;
  Select *local_138;
  int local_120;
  byte local_108;
  SelectDest destA;
  SelectDest dest;
  KeyInfo *local_70;
  SelectDest local_58;
  
  psVar3 = pParse->db;
  pSVar35 = p->pPrior;
  dest.pOrderBy = pDest->pOrderBy;
  dest.eDest = pDest->eDest;
  dest._1_3_ = *(undefined3 *)&pDest->field_0x1;
  dest.iSDParm = pDest->iSDParm;
  dest.iSDParm2 = pDest->iSDParm2;
  dest.iSdst = pDest->iSdst;
  dest.nSdst = pDest->nSdst;
  dest._20_4_ = *(undefined4 *)&pDest->field_0x14;
  dest.zAffSdst = pDest->zAffSdst;
  pVVar17 = sqlite3GetVdbe(pParse);
  if (dest.eDest == '\f') {
    sqlite3VdbeAddOp3(pVVar17,0x76,dest.iSDParm,p->pEList->nExpr,0);
    dest.eDest = '\x0e';
  }
  if ((p->selFlags & 0x400) != 0) {
    pEVar20 = p->pLimit;
    bVar38 = p->pWin == (Window *)0x0;
    iVar15 = -1;
    if (bVar38) {
      if (p->pPrior == (Select *)0x0) {
        sVar31 = 1;
        pSVar18 = p;
      }
      else {
        sVar31 = 1;
        pSVar28 = p->pPrior;
        do {
          pSVar18 = pSVar28;
          bVar38 = pSVar18->pWin == (Window *)0x0;
          if (!bVar38) {
            iVar15 = -1;
            goto LAB_001767ba;
          }
          sVar31 = sVar31 + (ushort)(pEVar20 == (Expr *)0x0);
          pSVar28 = pSVar18->pPrior;
        } while (pSVar18->pPrior != (Select *)0x0);
      }
      sqlite3VdbeExplain(pParse,'\0',"SCAN %d CONSTANT ROW%s");
      while ((pSVar18 != (Select *)0x0 &&
             (selectInnerLoop(pParse,pSVar18,-1,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,1,1),
             pEVar20 == (Expr *)0x0))) {
        pSVar18->nSelectRow = sVar31;
        pSVar18 = pSVar18->pNext;
      }
      iVar15 = 0;
    }
LAB_001767ba:
    if (bVar38) {
      local_138 = (Select *)0x0;
      goto LAB_00177db2;
    }
  }
  if ((p->selFlags & 0x2000) == 0) {
LAB_00176816:
    pEVar19 = p->pOrderBy;
    if (pEVar19 != (ExprList *)0x0) {
      psVar3 = pParse->db;
      pVVar17 = pParse->pVdbe;
      iVar15 = pParse->nLabel;
      iVar24 = iVar15 + -2;
      pParse->nLabel = iVar24;
      bVar7 = p->op;
      iVar14 = pEVar19->nExpr;
      if ((bVar7 != 0x87) && (psVar3->mallocFailed == '\0')) {
        uVar10 = 1;
        do {
          if (p->pEList->nExpr < (int)uVar10) break;
          if (iVar14 < 1) {
            iVar13 = 0;
          }
          else {
            paVar27 = &pEVar19->a[0].u;
            iVar36 = 0;
            do {
              iVar13 = iVar36;
              if (uVar10 == (paVar27->x).iOrderByCol) break;
              iVar36 = iVar36 + 1;
              paVar27 = paVar27 + 6;
              iVar13 = iVar14;
            } while (iVar14 != iVar36);
          }
          bVar6 = true;
          bVar38 = bVar6;
          if (iVar13 == iVar14) {
            destA.eDest = '\0';
            destA._1_3_ = 0;
            destA.iSDParm = 0;
            destA.iSDParm2 = 0;
            pEVar20 = sqlite3ExprAlloc(psVar3,0x9b,(Token *)&destA,0);
            bVar38 = pEVar20 != (Expr *)0x0;
            if (bVar38) {
              pbVar1 = (byte *)((long)&pEVar20->flags + 1);
              *pbVar1 = *pbVar1 | 8;
              (pEVar20->u).iValue = uVar10;
              pEVar19 = sqlite3ExprListAppend(pParse,pEVar19,pEVar20);
              p->pOrderBy = pEVar19;
              bVar38 = bVar6;
              if (pEVar19 != (ExprList *)0x0) {
                lVar37 = (long)iVar14;
                iVar14 = iVar14 + 1;
                pEVar19->a[lVar37].u.x.iOrderByCol = (u16)uVar10;
              }
            }
          }
          if (!bVar38) {
            return 7;
          }
          uVar10 = uVar10 + 1;
        } while (psVar3->mallocFailed == '\0');
      }
      zP4 = (int *)sqlite3DbMallocRawNN(psVar3,(long)iVar14 * 4 + 4);
      iVar13 = 0;
      if (zP4 == (int *)0x0) {
        local_70 = (KeyInfo *)0x0;
      }
      else {
        *zP4 = iVar14;
        uVar30 = extraout_RDX;
        if (0 < iVar14) {
          paVar27 = &pEVar19->a[0].u;
          uVar30 = 1;
          do {
            zP4[uVar30] = (paVar27->x).iOrderByCol - 1;
            uVar30 = uVar30 + 1;
            paVar27 = paVar27 + 6;
          } while (iVar14 + 1 != uVar30);
        }
        local_70 = multiSelectOrderByKeyInfo(pParse,p,(int)uVar30);
      }
      if (bVar7 == 0x87) {
        pKVar21 = (KeyInfo *)0x0;
      }
      else {
        uVar10 = p->pEList->nExpr;
        iVar13 = pParse->nMem + 1;
        pParse->nMem = pParse->nMem + uVar10 + 1;
        sqlite3VdbeAddOp3(pVVar17,0x47,0,iVar13,0);
        pKVar21 = sqlite3KeyInfoAlloc(psVar3,uVar10,1);
        if (0 < (int)uVar10 && pKVar21 != (KeyInfo *)0x0) {
          uVar30 = 0;
          do {
            pCVar22 = multiSelectCollSeq(pParse,p,(int)uVar30);
            pKVar21->aColl[uVar30] = pCVar22;
            pKVar21->aSortFlags[uVar30] = '\0';
            uVar30 = uVar30 + 1;
          } while (uVar10 != uVar30);
        }
      }
      uVar10 = 1;
      local_108 = bVar7 & 0xfe;
      if (((bVar7 & 0xfe) == 0x86) && ((psVar3->dbOptFlags & 0x200000) == 0)) {
        pSVar18 = p->pPrior;
        pSVar35 = p;
        while ((pSVar28 = pSVar18, pSVar28 != (Select *)0x0 && (pSVar35->op == bVar7))) {
          uVar10 = uVar10 + 1;
          pSVar18 = pSVar28->pPrior;
          pSVar35 = pSVar28;
        }
      }
      iVar15 = iVar15 + -1;
      pSVar35 = p;
      if (3 < uVar10) {
        uVar25 = 2;
        do {
          pSVar35 = pSVar35->pPrior;
          uVar25 = uVar25 + 2;
        } while (uVar25 < uVar10);
      }
      pSVar18 = pSVar35->pPrior;
      pSVar35->pPrior = (Select *)0x0;
      iVar36 = 0;
      pSVar18->pNext = (Select *)0x0;
      pEVar19 = sqlite3ExprListDup(pParse->db,pEVar19,0);
      pSVar18->pOrderBy = pEVar19;
      sqlite3ResolveOrderGroupBy(pParse,p,p->pOrderBy,"ORDER");
      sqlite3ResolveOrderGroupBy(pParse,pSVar18,pSVar18->pOrderBy,"ORDER");
      computeLimitRegisters(pParse,p,iVar15);
      iVar32 = p->iLimit;
      iVar26 = 0;
      if (iVar32 != 0 && bVar7 == 0x87) {
        iVar36 = pParse->nMem + 1;
        iVar26 = pParse->nMem + 2;
        pParse->nMem = iVar26;
        iVar16 = p->iOffset + 1;
        if (p->iOffset == 0) {
          iVar16 = iVar32;
        }
        sqlite3VdbeAddOp3(pVVar17,0x50,iVar16,iVar36,0);
        sqlite3VdbeAddOp3(pVVar17,0x50,iVar36,iVar26,0);
      }
      if (p->pLimit != (Expr *)0x0) {
        sqlite3ExprDeleteNN(psVar3,p->pLimit);
      }
      p->pLimit = (Expr *)0x0;
      iVar33 = pParse->nMem;
      iVar32 = iVar33 + 1;
      iVar16 = iVar33 + 2;
      iVar34 = iVar33 + 4;
      pParse->nMem = iVar34;
      destA.eDest = '\r';
      destA.iSDParm = iVar32;
      destA.iSDParm2 = 0;
      destA.zAffSdst = (char *)0x0;
      destA.iSdst = 0;
      destA.nSdst = 0;
      local_58.eDest = '\r';
      local_58.iSDParm2 = 0;
      local_58.zAffSdst = (char *)0x0;
      local_58.iSdst = 0;
      local_58.nSdst = 0;
      iVar33 = iVar33 + 3;
      local_58.iSDParm = iVar16;
      sqlite3VdbeExplain(pParse,'\x01',"MERGE (%s)");
      iVar11 = sqlite3VdbeAddOp3(pVVar17,10,iVar32,0,pVVar17->nOp + 1);
      pSVar18->iLimit = iVar36;
      sqlite3VdbeExplain(pParse,'\x01',"LEFT");
      sqlite3Select(pParse,pSVar18,&destA);
      sqlite3VdbeAddOp3(pVVar17,0x44,iVar32,0,0);
      pPVar4 = pVVar17->pParse;
      pPVar4->nTempReg = '\0';
      pPVar4->nRangeReg = 0;
      iVar36 = pVVar17->nOp;
      if (pVVar17->db->mallocFailed == '\0') {
        iVar12 = iVar36 + -1;
        if (-1 < iVar11) {
          iVar12 = iVar11;
        }
        pOVar23 = pVVar17->aOp + iVar12;
      }
      else {
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar23->p2 = iVar36;
      iVar12 = sqlite3VdbeAddOp3(pVVar17,10,iVar16,0,iVar36 + 1);
      iVar36 = p->iLimit;
      iVar11 = p->iOffset;
      p->iLimit = iVar26;
      p->iOffset = 0;
      sqlite3VdbeExplain(pParse,'\x01',"RIGHT");
      sqlite3Select(pParse,p,&local_58);
      p->iLimit = iVar36;
      p->iOffset = iVar11;
      sqlite3VdbeAddOp3(pVVar17,0x44,iVar16,0,0);
      pPVar4 = pVVar17->pParse;
      pPVar4->nTempReg = '\0';
      iVar36 = 0;
      pPVar4->nRangeReg = 0;
      iVar26 = generateOutputSubroutine(pParse,p,&destA,pDest,iVar33,iVar13,pKVar21,iVar15);
      if (local_108 == 0x86) {
        iVar36 = generateOutputSubroutine(pParse,p,&local_58,pDest,iVar34,iVar13,pKVar21,iVar15);
      }
      if ((pKVar21 != (KeyInfo *)0x0) && (pKVar21->nRef = pKVar21->nRef - 1, pKVar21->nRef == 0)) {
        sqlite3DbFreeNN(pKVar21->db,pKVar21);
      }
      iVar13 = iVar15;
      iVar11 = iVar15;
      if (local_108 != 0x88) {
        iVar11 = sqlite3VdbeAddOp3(pVVar17,9,iVar34,iVar36,0);
        iVar13 = sqlite3VdbeAddOp3(pVVar17,0xb,iVar16,iVar15,0);
        sqlite3VdbeAddOp3(pVVar17,8,0,iVar11,0);
        LVar9 = sqlite3LogEstAdd(p->nSelectRow,pSVar18->nSelectRow);
        p->nSelectRow = LVar9;
      }
      if (bVar7 == 0x89) {
        p2 = iVar11;
        if (pSVar18->nSelectRow < p->nSelectRow) {
          p->nSelectRow = pSVar18->nSelectRow;
        }
      }
      else {
        p2 = sqlite3VdbeAddOp3(pVVar17,9,iVar33,iVar26,0);
        sqlite3VdbeAddOp3(pVVar17,0xb,iVar32,iVar15,0);
        sqlite3VdbeAddOp3(pVVar17,8,0,p2,0);
      }
      iVar33 = sqlite3VdbeAddOp3(pVVar17,9,iVar33,iVar26,0);
      sqlite3VdbeAddOp3(pVVar17,0xb,iVar32,iVar11,0);
      sqlite3VdbeAddOp3(pVVar17,8,0,iVar24,0);
      iVar26 = iVar33;
      if (bVar7 != 0x87) {
        if (bVar7 == 0x89) {
          iVar26 = iVar33 + 1;
        }
        else {
          iVar33 = sqlite3VdbeAddOp3(pVVar17,0xb,iVar32,iVar11,0);
          sqlite3VdbeAddOp3(pVVar17,8,0,iVar24,0);
        }
      }
      iVar11 = pVVar17->nOp;
      if (local_108 == 0x86) {
        sqlite3VdbeAddOp3(pVVar17,9,iVar34,iVar36,0);
      }
      sqlite3VdbeAddOp3(pVVar17,0xb,iVar16,p2,0);
      sqlite3VdbeAddOp3(pVVar17,8,0,iVar24,0);
      if (pVVar17->db->mallocFailed == '\0') {
        iVar36 = pVVar17->nOp + -1;
        if (-1 < iVar12) {
          iVar36 = iVar12;
        }
        pOVar23 = pVVar17->aOp + iVar36;
      }
      else {
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar23->p2 = pVVar17->nOp;
      sqlite3VdbeAddOp3(pVVar17,0xb,iVar32,iVar13,0);
      sqlite3VdbeAddOp3(pVVar17,0xb,iVar16,p2,0);
      sqlite3VdbeResolveLabel(pVVar17,iVar24);
      iVar24 = sqlite3VdbeAddOp3(pVVar17,0x59,0,0,0);
      sqlite3VdbeChangeP4(pVVar17,iVar24,(char *)zP4,-0xe);
      iVar14 = sqlite3VdbeAddOp3(pVVar17,0x5a,destA.iSdst,local_58.iSdst,iVar14);
      sqlite3VdbeChangeP4(pVVar17,iVar14,(char *)local_70,-8);
      if (0 < (long)pVVar17->nOp) {
        pVVar17->aOp[(long)pVVar17->nOp + -1].p5 = 1;
      }
      sqlite3VdbeAddOp3(pVVar17,0xd,iVar26,iVar33,iVar11);
      sqlite3VdbeResolveLabel(pVVar17,iVar15);
      if (pSVar35->pPrior != (Select *)0x0) {
        sqlite3ParserAddCleanup(pParse,sqlite3SelectDelete,pSVar35->pPrior);
      }
      pSVar35->pPrior = pSVar18;
      pSVar18->pNext = pSVar35;
      if (pSVar18->pOrderBy != (ExprList *)0x0) {
        exprListDeleteNN(psVar3,pSVar18->pOrderBy);
      }
      pSVar18->pOrderBy = (ExprList *)0x0;
      sqlite3VdbeExplainPop(pParse);
      return (uint)(pParse->nErr != 0);
    }
    if (pSVar35->pPrior == (Select *)0x0) {
      sqlite3VdbeExplain(pParse,'\x01',"COMPOUND QUERY");
      sqlite3VdbeExplain(pParse,'\x01',"LEFT-MOST SUBQUERY");
    }
    uVar8 = p->op;
    if ((uVar8 == 0x86) || (uVar8 == 0x88)) {
      uVar8 = dest.eDest;
      if (dest.eDest == '\x01') {
        iVar14 = dest.iSDParm;
      }
      else {
        iVar14 = pParse->nTab;
        pParse->nTab = iVar14 + 1;
        iVar15 = sqlite3VdbeAddOp3(pVVar17,0x76,iVar14,0,0);
        p->addrOpenEphm[0] = iVar15;
        pSVar18 = p;
        do {
          pSVar28 = pSVar18;
          pSVar18 = pSVar28->pNext;
        } while (pSVar18 != (Select *)0x0);
        puVar2 = &pSVar28->selFlags;
        *(byte *)puVar2 = (byte)*puVar2 | 0x20;
      }
      destA.eDest = '\x01';
      destA.iSDParm = iVar14;
      destA.iSDParm2 = 0;
      destA.zAffSdst = (char *)0x0;
      local_138 = (Select *)0x0;
      destA.iSdst = 0;
      destA.nSdst = 0;
      iVar24 = sqlite3Select(pParse,pSVar35,&destA);
      iVar15 = iVar24;
      if (iVar24 == 0) {
        p->pPrior = (Select *)0x0;
        pEVar20 = p->pLimit;
        p->pLimit = (Expr *)0x0;
        destA.eDest = (p->op == 0x88) + '\x01';
        bVar7 = p->op + 0x79;
        if (bVar7 < 3) {
          pcVar29 = (&PTR_anon_var_dwarf_3383d_001ccd88)[bVar7];
        }
        else {
          pcVar29 = "UNION";
        }
        sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar29);
        iVar15 = sqlite3Select(pParse,p,&destA);
        local_138 = p->pPrior;
        p->pPrior = pSVar35;
        p->pOrderBy = (ExprList *)0x0;
        if (p->op == 0x86) {
          LVar9 = sqlite3LogEstAdd(p->nSelectRow,pSVar35->nSelectRow);
          p->nSelectRow = LVar9;
        }
        if (p->pLimit != (Expr *)0x0) {
          sqlite3ExprDeleteNN(psVar3,p->pLimit);
        }
        p->pLimit = pEVar20;
        p->iLimit = 0;
        p->iOffset = 0;
        if ((uVar8 != '\x01') && (psVar3->mallocFailed == '\0')) {
          iVar13 = pParse->nLabel + -1;
          iVar32 = pParse->nLabel + -2;
          pParse->nLabel = iVar32;
          computeLimitRegisters(pParse,p,iVar13);
          sqlite3VdbeAddOp3(pVVar17,0x23,iVar14,iVar13,0);
          iVar36 = pVVar17->nOp;
          selectInnerLoop(pParse,p,iVar14,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,iVar32,iVar13);
          sqlite3VdbeResolveLabel(pVVar17,iVar32);
          sqlite3VdbeAddOp3(pVVar17,0x26,iVar14,iVar36,0);
          sqlite3VdbeResolveLabel(pVVar17,iVar13);
          sqlite3VdbeAddOp3(pVVar17,0x7a,iVar14,0,0);
        }
      }
    }
    else if (uVar8 == 0x87) {
      destA._0_8_ = destA._0_8_ & 0xffffffff00000000;
      pSVar35->iLimit = p->iLimit;
      pSVar35->iOffset = p->iOffset;
      pSVar35->pLimit = p->pLimit;
      iVar24 = sqlite3Select(pParse,pSVar35,&dest);
      pSVar35->pLimit = (Expr *)0x0;
      if (iVar24 == 0) {
        iVar14 = 0;
        p->pPrior = (Select *)0x0;
        iVar15 = pSVar35->iLimit;
        p->iLimit = iVar15;
        p->iOffset = pSVar35->iOffset;
        if (iVar15 != 0) {
          iVar14 = sqlite3VdbeAddOp3(pVVar17,0x10,iVar15,0,0);
          iVar15 = p->iOffset;
          if (iVar15 != 0) {
            sqlite3VdbeAddOp3(pVVar17,0xa0,p->iLimit,iVar15 + 1,iVar15);
          }
        }
        sqlite3VdbeExplain(pParse,'\x01',"UNION ALL");
        iVar15 = sqlite3Select(pParse,p,&dest);
        local_138 = p->pPrior;
        p->pPrior = pSVar35;
        LVar9 = sqlite3LogEstAdd(p->nSelectRow,pSVar35->nSelectRow);
        p->nSelectRow = LVar9;
        if (p->pLimit != (Expr *)0x0) {
          iVar13 = sqlite3ExprIsInteger(p->pLimit->pLeft,(int *)&destA);
          if ((0 < (int)destA._0_4_ && iVar13 != 0) &&
             (sVar31 = p->nSelectRow, LVar9 = sqlite3LogEst(destA._0_8_ & 0xffffffff),
             LVar9 < sVar31)) {
            p->nSelectRow = LVar9;
          }
        }
        if (iVar14 != 0) {
          if (pVVar17->db->mallocFailed == '\0') {
            iVar13 = pVVar17->nOp + -1;
            if (-1 < iVar14) {
              iVar13 = iVar14;
            }
            pOVar23 = pVVar17->aOp + iVar13;
          }
          else {
            pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar23->p2 = pVVar17->nOp;
        }
      }
      else {
        local_138 = (Select *)0x0;
        iVar15 = iVar24;
      }
    }
    else {
      iVar14 = pParse->nTab;
      pParse->nTab = iVar14 + 2;
      iVar15 = sqlite3VdbeAddOp3(pVVar17,0x76,iVar14,0,0);
      p->addrOpenEphm[0] = iVar15;
      pSVar18 = p;
      do {
        pSVar28 = pSVar18;
        pSVar18 = pSVar28->pNext;
      } while (pSVar18 != (Select *)0x0);
      puVar2 = &pSVar28->selFlags;
      *(byte *)puVar2 = (byte)*puVar2 | 0x20;
      destA.eDest = '\x01';
      destA.iSDParm = iVar14;
      destA.iSDParm2 = 0;
      local_138 = (Select *)0x0;
      destA.zAffSdst = (char *)0x0;
      destA.iSdst = 0;
      destA.nSdst = 0;
      iVar24 = sqlite3Select(pParse,pSVar35,&destA);
      iVar15 = iVar24;
      if (iVar24 == 0) {
        iVar13 = iVar14 + 1;
        iVar15 = sqlite3VdbeAddOp3(pVVar17,0x76,iVar13,0,0);
        p->addrOpenEphm[1] = iVar15;
        p->pPrior = (Select *)0x0;
        pEVar20 = p->pLimit;
        p->pLimit = (Expr *)0x0;
        destA.iSDParm = iVar13;
        bVar7 = p->op + 0x79;
        if (bVar7 < 3) {
          pcVar29 = (&PTR_anon_var_dwarf_3383d_001ccd88)[bVar7];
        }
        else {
          pcVar29 = "UNION";
        }
        sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar29);
        iVar15 = sqlite3Select(pParse,p,&destA);
        local_138 = p->pPrior;
        p->pPrior = pSVar35;
        if (pSVar35->nSelectRow < p->nSelectRow) {
          p->nSelectRow = pSVar35->nSelectRow;
        }
        if (p->pLimit != (Expr *)0x0) {
          sqlite3ExprDeleteNN(psVar3,p->pLimit);
        }
        p->pLimit = pEVar20;
        if (iVar15 == 0) {
          iVar15 = pParse->nLabel + -1;
          iVar36 = pParse->nLabel + -2;
          pParse->nLabel = iVar36;
          computeLimitRegisters(pParse,p,iVar15);
          sqlite3VdbeAddOp3(pVVar17,0x23,iVar14,iVar15,0);
          if (pParse->nTempReg == '\0') {
            iVar32 = pParse->nMem + 1;
            pParse->nMem = iVar32;
          }
          else {
            bVar7 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar7;
            iVar32 = pParse->aTempReg[bVar7];
          }
          iVar26 = sqlite3VdbeAddOp3(pVVar17,0x86,iVar14,iVar32,0);
          iVar16 = sqlite3VdbeAddOp3(pVVar17,0x1b,iVar13,iVar36,iVar32);
          if (pVVar17->db->mallocFailed == '\0') {
            pOVar23 = pVVar17->aOp;
            pOVar23[iVar16].p4type = -3;
            pOVar23[iVar16].p4.i = 0;
          }
          if (iVar32 != 0) {
            bVar7 = pParse->nTempReg;
            if ((ulong)bVar7 < 8) {
              pParse->nTempReg = bVar7 + 1;
              pParse->aTempReg[bVar7] = iVar32;
            }
          }
          selectInnerLoop(pParse,p,iVar14,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,iVar36,iVar15);
          sqlite3VdbeResolveLabel(pVVar17,iVar36);
          sqlite3VdbeAddOp3(pVVar17,0x26,iVar14,iVar26,0);
          sqlite3VdbeResolveLabel(pVVar17,iVar15);
          sqlite3VdbeAddOp3(pVVar17,0x7a,iVar13,0,0);
          sqlite3VdbeAddOp3(pVVar17,0x7a,iVar14,0,0);
          iVar15 = 0;
        }
      }
    }
    if (iVar24 != 0) goto LAB_00177db2;
    if (p->pNext == (Select *)0x0) {
      sqlite3VdbeExplainPop(pParse);
    }
  }
  else {
    bVar38 = p == (Select *)0x0;
    pSVar18 = p;
    if (bVar38) {
LAB_001767f1:
      if (bVar38) goto LAB_00176816;
    }
    else {
      do {
        pSVar18 = pSVar18->pPrior;
        bVar38 = pSVar18 == (Select *)0x0;
        if (bVar38) goto LAB_001767f1;
      } while ((pSVar18->selFlags & 0x2000) != 0);
    }
    if (p->pWin == (Window *)0x0) {
      pSVar5 = p->pSrc;
      iVar15 = p->pEList->nExpr;
      p_00 = pParse->pVdbe;
      iVar14 = sqlite3AuthCheck(pParse,0x21,(char *)0x0,(char *)0x0,(char *)0x0);
      if (iVar14 == 0) {
        iVar36 = pParse->nLabel + -1;
        pParse->nLabel = iVar36;
        p->nSelectRow = 0x140;
        computeLimitRegisters(pParse,p,iVar36);
        pEVar20 = p->pLimit;
        iVar14 = p->iLimit;
        iVar24 = p->iOffset;
        p->pLimit = (Expr *)0x0;
        p->iLimit = 0;
        p->iOffset = 0;
        iVar13 = 0;
        if (0 < (long)pSVar5->nSrc) {
          lVar37 = 0;
          do {
            if (((&pSVar5->a[0].fg.field_0x1)[lVar37] & 0x40) != 0) {
              iVar13 = *(int *)((long)&pSVar5->a[0].iCursor + lVar37);
              goto LAB_0017771c;
            }
            lVar37 = lVar37 + 0x68;
          } while ((long)pSVar5->nSrc * 0x68 - lVar37 != 0);
          iVar13 = 0;
        }
LAB_0017771c:
        pEVar19 = p->pOrderBy;
        iVar32 = pParse->nTab;
        local_120 = iVar32 + 1;
        pParse->nTab = local_120;
        if (p->op == 0x86) {
          uVar8 = '\x06' - (pEVar19 == (ExprList *)0x0);
          pParse->nTab = iVar32 + 2;
        }
        else {
          local_120 = 0;
          uVar8 = (pEVar19 == (ExprList *)0x0) + '\a';
        }
        destA.eDest = uVar8;
        destA.iSDParm = iVar32;
        destA.iSDParm2 = 0;
        destA.zAffSdst = (char *)0x0;
        destA.iSdst = 0;
        destA.nSdst = 0;
        iVar26 = pParse->nMem + 1;
        pParse->nMem = iVar26;
        sqlite3VdbeAddOp3(p_00,0x79,iVar13,iVar26,iVar15);
        if (pEVar19 == (ExprList *)0x0) {
          sqlite3VdbeAddOp3(p_00,0x76,iVar32,iVar15,0);
        }
        else {
          pKVar21 = multiSelectOrderByKeyInfo(pParse,p,nExtra);
          iVar15 = sqlite3VdbeAddOp3(p_00,0x76,iVar32,pEVar19->nExpr + 2,0);
          sqlite3VdbeChangeP4(p_00,iVar15,(char *)pKVar21,-8);
          destA.pOrderBy = pEVar19;
        }
        if (local_120 != 0) {
          iVar15 = sqlite3VdbeAddOp3(p_00,0x76,local_120,0,0);
          p->addrOpenEphm[0] = iVar15;
          *(byte *)&p->selFlags = (byte)p->selFlags | 0x20;
        }
        p->pOrderBy = (ExprList *)0x0;
        pSVar35 = p;
        do {
          pSVar18 = pSVar35;
          if (pSVar18 == (Select *)0x0) break;
          if ((pSVar18->selFlags & 8) != 0) {
            sqlite3ErrorMsg(pParse,"recursive aggregate queries not supported");
            goto LAB_00177b47;
          }
          pSVar18->op = 0x87;
          pSVar35 = pSVar18->pPrior;
        } while ((pSVar18->pPrior->selFlags & 0x2000) != 0);
        pSVar35 = pSVar18->pPrior;
        pSVar35->pNext = (Select *)0x0;
        sqlite3VdbeExplain(pParse,'\x01',"SETUP");
        iVar15 = sqlite3Select(pParse,pSVar35,&destA);
        pSVar35->pNext = p;
        if (iVar15 == 0) {
          iVar15 = sqlite3VdbeAddOp3(p_00,0x23,iVar32,iVar36,0);
          sqlite3VdbeAddOp3(p_00,0x88,iVar13,0,0);
          if (pEVar19 == (ExprList *)0x0) {
            iVar33 = 0x86;
            iVar34 = 0;
            iVar16 = iVar26;
          }
          else {
            iVar33 = 0x5e;
            iVar16 = pEVar19->nExpr + 1;
            iVar34 = iVar26;
          }
          sqlite3VdbeAddOp3(p_00,iVar33,iVar32,iVar16,iVar34);
          sqlite3VdbeAddOp3(p_00,0x82,iVar32,0,0);
          iVar32 = pParse->nLabel + -1;
          pParse->nLabel = iVar32;
          if (0 < iVar24) {
            sqlite3VdbeAddOp3(p_00,0x31,iVar24,iVar32,1);
          }
          selectInnerLoop(pParse,p,iVar13,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,iVar32,iVar36);
          if (iVar14 != 0) {
            sqlite3VdbeAddOp3(p_00,0x3c,iVar14,iVar36,0);
          }
          sqlite3VdbeResolveLabel(p_00,iVar32);
          pSVar18->pPrior = (Select *)0x0;
          sqlite3VdbeExplain(pParse,'\x01',"RECURSIVE STEP");
          sqlite3Select(pParse,p,&destA);
          pSVar18->pPrior = pSVar35;
          sqlite3VdbeAddOp3(p_00,8,0,iVar15,0);
          sqlite3VdbeResolveLabel(p_00,iVar36);
        }
LAB_00177b47:
        if (p->pOrderBy != (ExprList *)0x0) {
          exprListDeleteNN(pParse->db,p->pOrderBy);
        }
        p->pOrderBy = pEVar19;
        p->pLimit = pEVar20;
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"cannot use window functions in recursive queries");
    }
    local_138 = (Select *)0x0;
    iVar15 = 0;
  }
  if ((pParse->nErr == 0) && ((p->selFlags & 0x20) != 0)) {
    iVar14 = p->pEList->nExpr;
    pKVar21 = sqlite3KeyInfoAlloc(psVar3,iVar14,1);
    if (pKVar21 == (KeyInfo *)0x0) {
      iVar15 = 7;
    }
    else {
      if (0 < iVar14) {
        lVar37 = 0;
        do {
          pCVar22 = multiSelectCollSeq(pParse,p,(int)lVar37);
          pKVar21->aColl[lVar37] = pCVar22;
          if (pCVar22 == (CollSeq *)0x0) {
            pKVar21->aColl[lVar37] = psVar3->pDfltColl;
          }
          lVar37 = lVar37 + 1;
        } while (iVar14 != (int)lVar37);
      }
      if (p != (Select *)0x0) {
        do {
          lVar37 = 0;
          do {
            iVar24 = p->addrOpenEphm[lVar37];
            if ((long)iVar24 < 0) break;
            pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (pVVar17->db->mallocFailed == '\0') {
              pOVar23 = pVVar17->aOp + iVar24;
            }
            pOVar23->p2 = iVar14;
            pKVar21->nRef = pKVar21->nRef + 1;
            sqlite3VdbeChangeP4(pVVar17,iVar24,(char *)pKVar21,-8);
            p->addrOpenEphm[lVar37] = -1;
            lVar37 = lVar37 + 1;
          } while (lVar37 == 1);
          p = p->pPrior;
        } while (p != (Select *)0x0);
      }
      pKVar21->nRef = pKVar21->nRef - 1;
      if (pKVar21->nRef == 0) {
        sqlite3DbFreeNN(pKVar21->db,pKVar21);
      }
    }
  }
LAB_00177db2:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  if (local_138 != (Select *)0x0) {
    sqlite3ParserAddCleanup(pParse,sqlite3SelectDelete,local_138);
  }
  return iVar15;
}

Assistant:

static int multiSelect(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int rc = SQLITE_OK;   /* Success code from a subroutine */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest dest;      /* Alternative data destination */
  Select *pDelete = 0;  /* Chain of simple selects to delete */
  sqlite3 *db;          /* Database connection */

  /* Make sure there is no ORDER BY or LIMIT clause on prior SELECTs.  Only
  ** the last (right-most) SELECT in the series may have an ORDER BY or LIMIT.
  */
  assert( p && p->pPrior );  /* Calling function guarantees this much */
  assert( (p->selFlags & SF_Recursive)==0 || p->op==TK_ALL || p->op==TK_UNION );
  assert( p->selFlags & SF_Compound );
  db = pParse->db;
  pPrior = p->pPrior;
  dest = *pDest;
  assert( pPrior->pOrderBy==0 );
  assert( pPrior->pLimit==0 );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );  /* The VDBE already created by calling function */

  /* Create the destination temporary table if necessary
  */
  if( dest.eDest==SRT_EphemTab ){
    assert( p->pEList );
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, dest.iSDParm, p->pEList->nExpr);
    dest.eDest = SRT_Table;
  }

  /* Special handling for a compound-select that originates as a VALUES clause.
  */
  if( p->selFlags & SF_MultiValue ){
    rc = multiSelectValues(pParse, p, &dest);
    if( rc>=0 ) goto multi_select_end;
    rc = SQLITE_OK;
  }

  /* Make sure all SELECTs in the statement have the same number of elements
  ** in their result sets.
  */
  assert( p->pEList && pPrior->pEList );
  assert( p->pEList->nExpr==pPrior->pEList->nExpr );

#ifndef SQLITE_OMIT_CTE
  if( (p->selFlags & SF_Recursive)!=0 && hasAnchor(p) ){
    generateWithRecursiveQuery(pParse, p, &dest);
  }else
#endif

  /* Compound SELECTs that have an ORDER BY clause are handled separately.
  */
  if( p->pOrderBy ){
    return multiSelectOrderBy(pParse, p, pDest);
  }else{

#ifndef SQLITE_OMIT_EXPLAIN
    if( pPrior->pPrior==0 ){
      ExplainQueryPlan((pParse, 1, "COMPOUND QUERY"));
      ExplainQueryPlan((pParse, 1, "LEFT-MOST SUBQUERY"));
    }
#endif

    /* Generate code for the left and right SELECT statements.
    */
    switch( p->op ){
      case TK_ALL: {
        int addr = 0;
        int nLimit = 0;  /* Initialize to suppress harmless compiler warning */
        assert( !pPrior->pLimit );
        pPrior->iLimit = p->iLimit;
        pPrior->iOffset = p->iOffset;
        pPrior->pLimit = p->pLimit;
        SELECTTRACE(1, pParse, p, ("multiSelect UNION ALL left...\n"));
        rc = sqlite3Select(pParse, pPrior, &dest);
        pPrior->pLimit = 0;
        if( rc ){
          goto multi_select_end;
        }
        p->pPrior = 0;
        p->iLimit = pPrior->iLimit;
        p->iOffset = pPrior->iOffset;
        if( p->iLimit ){
          addr = sqlite3VdbeAddOp1(v, OP_IfNot, p->iLimit); VdbeCoverage(v);
          VdbeComment((v, "Jump ahead if LIMIT reached"));
          if( p->iOffset ){
            sqlite3VdbeAddOp3(v, OP_OffsetLimit,
                              p->iLimit, p->iOffset+1, p->iOffset);
          }
        }
        ExplainQueryPlan((pParse, 1, "UNION ALL"));
        SELECTTRACE(1, pParse, p, ("multiSelect UNION ALL right...\n"));
        rc = sqlite3Select(pParse, p, &dest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        if( p->pLimit
         && sqlite3ExprIsInteger(p->pLimit->pLeft, &nLimit)
         && nLimit>0 && p->nSelectRow > sqlite3LogEst((u64)nLimit)
        ){
          p->nSelectRow = sqlite3LogEst((u64)nLimit);
        }
        if( addr ){
          sqlite3VdbeJumpHere(v, addr);
        }
        break;
      }
      case TK_EXCEPT:
      case TK_UNION: {
        int unionTab;    /* Cursor number of the temp table holding result */
        u8 op = 0;       /* One of the SRT_ operations to apply to self */
        int priorOp;     /* The SRT_ operation to apply to prior selects */
        Expr *pLimit;    /* Saved values of p->nLimit  */
        int addr;
        SelectDest uniondest;

        testcase( p->op==TK_EXCEPT );
        testcase( p->op==TK_UNION );
        priorOp = SRT_Union;
        if( dest.eDest==priorOp ){
          /* We can reuse a temporary table generated by a SELECT to our
          ** right.
          */
          assert( p->pLimit==0 );      /* Not allowed on leftward elements */
          unionTab = dest.iSDParm;
        }else{
          /* We will need to create our own temporary table to hold the
          ** intermediate results.
          */
          unionTab = pParse->nTab++;
          assert( p->pOrderBy==0 );
          addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, unionTab, 0);
          assert( p->addrOpenEphm[0] == -1 );
          p->addrOpenEphm[0] = addr;
          findRightmost(p)->selFlags |= SF_UsesEphemeral;
          assert( p->pEList );
        }


        /* Code the SELECT statements to our left
        */
        assert( !pPrior->pOrderBy );
        sqlite3SelectDestInit(&uniondest, priorOp, unionTab);
        SELECTTRACE(1, pParse, p, ("multiSelect EXCEPT/UNION left...\n"));
        rc = sqlite3Select(pParse, pPrior, &uniondest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT statement
        */
        if( p->op==TK_EXCEPT ){
          op = SRT_Except;
        }else{
          assert( p->op==TK_UNION );
          op = SRT_Union;
        }
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        uniondest.eDest = op;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        SELECTTRACE(1, pParse, p, ("multiSelect EXCEPT/UNION right...\n"));
        rc = sqlite3Select(pParse, p, &uniondest);
        testcase( rc!=SQLITE_OK );
        assert( p->pOrderBy==0 );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->pOrderBy = 0;
        if( p->op==TK_UNION ){
          p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
        p->iLimit = 0;
        p->iOffset = 0;

        /* Convert the data in the temporary table into whatever form
        ** it is that we currently need.
        */
        assert( unionTab==dest.iSDParm || dest.eDest!=priorOp );
        assert( p->pEList || db->mallocFailed );
        if( dest.eDest!=priorOp && db->mallocFailed==0 ){
          int iCont, iBreak, iStart;
          iBreak = sqlite3VdbeMakeLabel(pParse);
          iCont = sqlite3VdbeMakeLabel(pParse);
          computeLimitRegisters(pParse, p, iBreak);
          sqlite3VdbeAddOp2(v, OP_Rewind, unionTab, iBreak); VdbeCoverage(v);
          iStart = sqlite3VdbeCurrentAddr(v);
          selectInnerLoop(pParse, p, unionTab,
                          0, 0, &dest, iCont, iBreak);
          sqlite3VdbeResolveLabel(v, iCont);
          sqlite3VdbeAddOp2(v, OP_Next, unionTab, iStart); VdbeCoverage(v);
          sqlite3VdbeResolveLabel(v, iBreak);
          sqlite3VdbeAddOp2(v, OP_Close, unionTab, 0);
        }
        break;
      }
      default: assert( p->op==TK_INTERSECT ); {
        int tab1, tab2;
        int iCont, iBreak, iStart;
        Expr *pLimit;
        int addr;
        SelectDest intersectdest;
        int r1;

        /* INTERSECT is different from the others since it requires
        ** two temporary tables.  Hence it has its own case.  Begin
        ** by allocating the tables we will need.
        */
        tab1 = pParse->nTab++;
        tab2 = pParse->nTab++;
        assert( p->pOrderBy==0 );

        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab1, 0);
        assert( p->addrOpenEphm[0] == -1 );
        p->addrOpenEphm[0] = addr;
        findRightmost(p)->selFlags |= SF_UsesEphemeral;
        assert( p->pEList );

        /* Code the SELECTs to our left into temporary table "tab1".
        */
        sqlite3SelectDestInit(&intersectdest, SRT_Union, tab1);
        SELECTTRACE(1, pParse, p, ("multiSelect INTERSECT left...\n"));
        rc = sqlite3Select(pParse, pPrior, &intersectdest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT into temporary table "tab2"
        */
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab2, 0);
        assert( p->addrOpenEphm[1] == -1 );
        p->addrOpenEphm[1] = addr;
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        intersectdest.iSDParm = tab2;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        SELECTTRACE(1, pParse, p, ("multiSelect INTERSECT right...\n"));
        rc = sqlite3Select(pParse, p, &intersectdest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        if( p->nSelectRow>pPrior->nSelectRow ){
          p->nSelectRow = pPrior->nSelectRow;
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;

        /* Generate code to take the intersection of the two temporary
        ** tables.
        */
        if( rc ) break;
        assert( p->pEList );
        iBreak = sqlite3VdbeMakeLabel(pParse);
        iCont = sqlite3VdbeMakeLabel(pParse);
        computeLimitRegisters(pParse, p, iBreak);
        sqlite3VdbeAddOp2(v, OP_Rewind, tab1, iBreak); VdbeCoverage(v);
        r1 = sqlite3GetTempReg(pParse);
        iStart = sqlite3VdbeAddOp2(v, OP_RowData, tab1, r1);
        sqlite3VdbeAddOp4Int(v, OP_NotFound, tab2, iCont, r1, 0);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, r1);
        selectInnerLoop(pParse, p, tab1,
                        0, 0, &dest, iCont, iBreak);
        sqlite3VdbeResolveLabel(v, iCont);
        sqlite3VdbeAddOp2(v, OP_Next, tab1, iStart); VdbeCoverage(v);
        sqlite3VdbeResolveLabel(v, iBreak);
        sqlite3VdbeAddOp2(v, OP_Close, tab2, 0);
        sqlite3VdbeAddOp2(v, OP_Close, tab1, 0);
        break;
      }
    }

  #ifndef SQLITE_OMIT_EXPLAIN
    if( p->pNext==0 ){
      ExplainQueryPlanPop(pParse);
    }
  #endif
  }
  if( pParse->nErr ) goto multi_select_end;

  /* Compute collating sequences used by
  ** temporary tables needed to implement the compound select.
  ** Attach the KeyInfo structure to all temporary tables.
  **
  ** This section is run by the right-most SELECT statement only.
  ** SELECT statements to the left always skip this part.  The right-most
  ** SELECT might also skip this part if it has no ORDER BY clause and
  ** no temp tables are required.
  */
  if( p->selFlags & SF_UsesEphemeral ){
    int i;                        /* Loop counter */
    KeyInfo *pKeyInfo;            /* Collating sequence for the result set */
    Select *pLoop;                /* For looping through SELECT statements */
    CollSeq **apColl;             /* For looping through pKeyInfo->aColl[] */
    int nCol;                     /* Number of columns in result set */

    assert( p->pNext==0 );
    assert( p->pEList!=0 );
    nCol = p->pEList->nExpr;
    pKeyInfo = sqlite3KeyInfoAlloc(db, nCol, 1);
    if( !pKeyInfo ){
      rc = SQLITE_NOMEM_BKPT;
      goto multi_select_end;
    }
    for(i=0, apColl=pKeyInfo->aColl; i<nCol; i++, apColl++){
      *apColl = multiSelectCollSeq(pParse, p, i);
      if( 0==*apColl ){
        *apColl = db->pDfltColl;
      }
    }

    for(pLoop=p; pLoop; pLoop=pLoop->pPrior){
      for(i=0; i<2; i++){
        int addr = pLoop->addrOpenEphm[i];
        if( addr<0 ){
          /* If [0] is unused then [1] is also unused.  So we can
          ** always safely abort as soon as the first unused slot is found */
          assert( pLoop->addrOpenEphm[1]<0 );
          break;
        }
        sqlite3VdbeChangeP2(v, addr, nCol);
        sqlite3VdbeChangeP4(v, addr, (char*)sqlite3KeyInfoRef(pKeyInfo),
                            P4_KEYINFO);
        pLoop->addrOpenEphm[i] = -1;
      }
    }
    sqlite3KeyInfoUnref(pKeyInfo);
  }

multi_select_end:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  if( pDelete ){
    sqlite3ParserAddCleanup(pParse,
        (void(*)(sqlite3*,void*))sqlite3SelectDelete,
        pDelete);
  }
  return rc;
}